

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *makeProgram,
          string *param_2,string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,int jobs,bool verbose,cmBuildOptions *buildOptions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer pbVar1;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *pvVar2;
  string *__args;
  pointer pbVar3;
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  allocator<char> local_99;
  GeneratedMakeCommand makeCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tname;
  string local_58;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *local_38;
  
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.RequiresOutputForward = false;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_38 = __return_storage_ptr__;
  if (verbose) {
    __args = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               __args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [4])0x6c36d5);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
               (char (*) [10])"VERBOSE=1");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_99);
  cmGlobalGenerator::SelectMakeProgram(&tname,(cmGlobalGenerator *)this,makeProgram,&local_58);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
             &tname);
  std::__cxx11::string::~string((string *)&tname);
  std::__cxx11::string::~string((string *)&local_58);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
             (char (*) [3])0x686285);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
             (char (*) [9])0x6d065b);
  if (jobs != -1) {
    if (jobs == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
                 (char (*) [3])"-j");
    }
    else {
      std::__cxx11::to_string(&local_58,jobs);
      std::operator+(&tname,"-j",&local_58);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
                 &tname);
      std::__cxx11::string::~string((string *)&tname);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&makeCommand,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = (targetNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (targetNames->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar2 = local_38, pbVar3 != pbVar1;
      pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&tname,(string *)pbVar3);
    if (tname._M_string_length != 0) {
      if (buildOptions->Fast == true) {
        std::__cxx11::string::append((char *)&tname);
      }
      cmSystemTools::ConvertToOutputSlashes(&tname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
                 &tname);
    }
    std::__cxx11::string::~string((string *)&tname);
  }
  tname._M_string_length =
       CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  tname._M_dataplus._M_p =
       (pointer)makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  tname.field_2._M_allocated_capacity =
       CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  tname.field_2._M_local_buf[8] = makeCommand.super_GeneratedMakeCommand.RequiresOutputForward;
  __l._M_len = 1;
  __l._M_array = (iterator)&tname;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(local_38,__l,(allocator_type *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tname);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&makeCommand);
  return pvVar2;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& /*projectName*/,
  const std::string& /*projectDir*/,
  std::vector<std::string> const& targetNames, const std::string& /*config*/,
  int jobs, bool verbose, const cmBuildOptions& buildOptions,
  std::vector<std::string> const& makeOptions)
{
  GeneratedMakeCommand makeCommand;

  // Make it possible to set verbosity also from command line
  if (verbose) {
    makeCommand.Add(cmSystemTools::GetCMakeCommand());
    makeCommand.Add("-E");
    makeCommand.Add("env");
    makeCommand.Add("VERBOSE=1");
  }
  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  // Explicitly tell the make tool to use the Makefile written by
  // cmLocalUnixMakefileGenerator3::WriteLocalMakefile
  makeCommand.Add("-f");
  makeCommand.Add("Makefile");

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    if (jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add("-j");
    } else {
      makeCommand.Add("-j" + std::to_string(jobs));
    }
  }

  makeCommand.Add(makeOptions.begin(), makeOptions.end());
  for (auto tname : targetNames) {
    if (!tname.empty()) {
      if (buildOptions.Fast) {
        tname += "/fast";
      }
      cmSystemTools::ConvertToOutputSlashes(tname);
      makeCommand.Add(std::move(tname));
    }
  }
  return { std::move(makeCommand) };
}